

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerObjectFormats.cpp
# Opt level: O1

void __thiscall jbcoin::InnerObjectFormats::InnerObjectFormats(InnerObjectFormats *this)

{
  _Rb_tree_header *p_Var1;
  Item *pIVar2;
  SOElement local_48;
  SOElement local_38;
  SOElement local_28;
  
  (this->super_KnownFormats<int>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KnownFormats<int>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KnownFormats<int>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header;
  (this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_KnownFormats<int>).m_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header;
  (this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_KnownFormats<int>).m_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_KnownFormats<int>)._vptr_KnownFormats = (_func_int **)&PTR_addCommonFields_002d71c0;
  pIVar2 = KnownFormats<int>::add(&this->super_KnownFormats<int>,_DAT_002e35b8,sfSignerEntry);
  local_38.e_field = (SField *)sfAccount;
  local_38.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_38);
  local_48.e_field = (SField *)sfSignerWeight;
  local_48.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_48);
  pIVar2 = KnownFormats<int>::add(&this->super_KnownFormats<int>,_DAT_002e3618,sfSigner);
  local_38.e_field = (SField *)sfAccount;
  local_38.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_38);
  local_48.e_field = (SField *)sfSigningPubKey;
  local_48.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_48);
  local_28.e_field = (SField *)sfTxnSignature;
  local_28.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_28);
  return;
}

Assistant:

InnerObjectFormats::InnerObjectFormats ()
{
    add (sfSignerEntry.getJsonName ().c_str (), sfSignerEntry.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSignerWeight,         SOE_REQUIRED)
        ;

    add (sfSigner.getJsonName ().c_str (), sfSigner.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSigningPubKey,        SOE_REQUIRED)
        << SOElement (sfTxnSignature,         SOE_REQUIRED)
        ;
}